

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipm.cc
# Opt level: O1

void __thiscall ipx::IPM::PrintOutput(IPM *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Control *this_00;
  bool bVar3;
  uint uVar4;
  ostream *poVar5;
  Basis *this_01;
  int in_ECX;
  int width;
  fmtflags in_R8D;
  char *pcVar6;
  double dVar7;
  Timer timer;
  stringstream h_logging_stream;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  double local_220;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  bVar3 = Iterate::feasible(this->iterate_);
  if (bVar3) {
    bVar3 = Iterate::optimal(this->iterate_);
    in_ECX = 0x3c6249;
    pcVar6 = " ";
    if (bVar3) {
      pcVar6 = "*";
    }
  }
  else {
    pcVar6 = " ";
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  paVar1 = &local_2a0.field_2;
  local_2a0._M_string_length = 0;
  local_2a0.field_2._M_local_buf[0] = '\0';
  local_2a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a0._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
  Format_abi_cxx11_(&local_2a0,(ipx *)(ulong)(uint)(this->info_->super_ipx_info).iter,3,in_ECX);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_2a0._M_dataplus._M_p,local_2a0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
  dVar7 = Iterate::presidual(this->iterate_);
  Format_abi_cxx11_(&local_280,(ipx *)0x8,dVar7,2,0x100,in_R8D);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_280._M_dataplus._M_p,local_280._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  dVar7 = Iterate::dresidual(this->iterate_);
  Format_abi_cxx11_(&local_240,(ipx *)0x8,dVar7,2,0x100,in_R8D);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_240._M_dataplus._M_p,local_240._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
  dVar7 = Iterate::pobjective_after_postproc(this->iterate_);
  Format_abi_cxx11_(&local_260,(ipx *)0xf,dVar7,8,0x100,in_R8D);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_260._M_dataplus._M_p,local_260._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  dVar7 = Iterate::dobjective_after_postproc(this->iterate_);
  Format_abi_cxx11_(&local_1d8,(ipx *)0xf,dVar7,8,0x100,in_R8D);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
  dVar7 = Iterate::mu(this->iterate_);
  Format_abi_cxx11_(&local_1f8,(ipx *)0x8,dVar7,2,0x100,in_R8D);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p);
  }
  paVar2 = &local_280.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar2) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a0._M_dataplus._M_p);
  }
  if ((this->control_->parameters_).super_ipx_parameters.timeless_log == false) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
    dVar7 = Control::Elapsed(this->control_);
    Format_abi_cxx11_(&local_2a0,(ipx *)0x6,dVar7,0,4,in_R8D);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_2a0._M_dataplus._M_p,local_2a0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"s",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2a0._M_dataplus._M_p);
    }
  }
  Control::hLog(this->control_,(stringstream *)local_1b8);
  poVar5 = Control::Debug(this->control_,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
  Format_abi_cxx11_(&local_2a0,(ipx *)0x4,this->step_primal_,2,4,in_R8D);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_2a0._M_dataplus._M_p,local_2a0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  width = 4;
  Format_abi_cxx11_(&local_280,(ipx *)0x4,this->step_dual_,2,4,in_R8D);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_280._M_dataplus._M_p,local_280._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
  uVar4 = KKTSolver::basis_changes(this->kkt_);
  Format_abi_cxx11_(&local_240,(ipx *)(ulong)uVar4,7,width);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_240._M_dataplus._M_p,local_240._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  uVar4 = KKTSolver::iter(this->kkt_);
  Format_abi_cxx11_(&local_260,(ipx *)(ulong)uVar4,7,width);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,local_260._M_dataplus._M_p,local_260._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar2) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a0._M_dataplus._M_p);
  }
  poVar5 = Control::Debug(this->control_,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
  Format_abi_cxx11_(&local_2a0,(ipx *)(ulong)(uint)(this->info_->super_ipx_info).dual_dropped,7,
                    width);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_2a0._M_dataplus._M_p,local_2a0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  Format_abi_cxx11_(&local_280,(ipx *)(ulong)(uint)(this->info_->super_ipx_info).primal_dropped,7,
                    width);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,local_280._M_dataplus._M_p,local_280._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar2) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a0._M_dataplus._M_p);
  }
  this_01 = KKTSolver::basis(this->kkt_);
  if (this_01 == (Basis *)0x0) {
    poVar5 = Control::Debug(this->control_,4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
    Format_abi_cxx11_(&local_2a0,(ipx *)0x3d204e,(char *)0x9,width);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,local_2a0._M_dataplus._M_p,local_2a0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2a0._M_dataplus._M_p);
    }
    poVar5 = Control::Debug(this->control_,4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
    Format_abi_cxx11_(&local_2a0,(ipx *)0x3d204e,(char *)0x8,width);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,local_2a0._M_dataplus._M_p,local_2a0._M_string_length);
  }
  else {
    poVar5 = Control::Debug(this->control_,4);
    if (((&poVar5->field_0x20)[(long)poVar5->_vptr_basic_ostream[-3]] & 5) != 0) goto LAB_003a1b46;
    poVar5 = Control::Debug(this->control_,4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
    dVar7 = Basis::MinSingularValue(this_01);
    Format_abi_cxx11_(&local_2a0,(ipx *)0x9,dVar7,2,0x100,in_R8D);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,local_2a0._M_dataplus._M_p,local_2a0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2a0._M_dataplus._M_p);
    }
    Timer::Timer((Timer *)&local_280);
    local_220 = Basis::DensityInverse(this_01);
    dVar7 = Timer::Elapsed((Timer *)&local_280);
    (this->info_->super_ipx_info).time_symb_invert =
         dVar7 + (this->info_->super_ipx_info).time_symb_invert;
    poVar5 = Control::Debug(this->control_,4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
    Format_abi_cxx11_(&local_2a0,(ipx *)0x8,local_220,2,0x100,in_R8D);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,local_2a0._M_dataplus._M_p,local_2a0._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a0._M_dataplus._M_p);
  }
LAB_003a1b46:
  this_00 = this->control_;
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"\n","");
  Control::hLog(this_00,&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void IPM::PrintOutput() {
    const bool ipm_optimal = iterate_->feasible() && iterate_->optimal();

    if (kTerminationLogging) PrintHeader();
    std::stringstream h_logging_stream;
    h_logging_stream.str(std::string());
    h_logging_stream
      << " "  << Format(info_->iter, 3)
      << (ipm_optimal ? "*" : " ")
      << "  " << Scientific(iterate_->presidual(), 8, 2)
      << " "  << Scientific(iterate_->dresidual(), 8, 2)
      << "  " << Scientific(iterate_->pobjective_after_postproc(), 15, 8)
      << " "  << Scientific(iterate_->dobjective_after_postproc(), 15, 8)
      << "  " << Scientific(iterate_->mu(), 8, 2);
    if (!control_.timelessLog())
      h_logging_stream << "  " << Fixed(control_.Elapsed(), 6, 0) << "s";
    control_.hLog(h_logging_stream);
    control_.Debug()
      << "  " << Fixed(step_primal_, 4, 2) << " " << Fixed(step_dual_, 4, 2)
      << "  " << Format(kkt_->basis_changes(), 7)
      << " "  << Format(kkt_->iter(), 7);
    control_.Debug()
      << "  " << Format(info_->dual_dropped, 7)
      << " "  << Format(info_->primal_dropped, 7);

    const Basis* basis = kkt_->basis();
    if (basis) {
        if (control_.Debug(4)) {
            control_.Debug(4) << "  "
                              << Scientific(basis->MinSingularValue(), 9, 2);
            Timer timer;
            double density = basis->DensityInverse();
            info_->time_symb_invert += timer.Elapsed();
            control_.Debug(4) << "  " << Scientific(density, 8, 2);
        }
    } else {
        control_.Debug(4) << "  " << Format("-", 9);
        control_.Debug(4) << "  " << Format("-", 8);
    }
    control_.hLog("\n");
}